

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O0

BOOL is_accelerated_repeat(PCRE2_SPTR16 cc)

{
  uint uVar1;
  uint local_28;
  bool local_21;
  PCRE2_SPTR16 cc_local;
  
  switch(*cc) {
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x2a:
  case 0x2b:
  case 0x2e:
  case 0x2f:
  case 0x30:
  case 0x31:
  case 0x37:
  case 0x38:
  case 0x3b:
  case 0x3c:
  case 0x3d:
  case 0x3e:
  case 0x44:
  case 0x45:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x51:
  case 0x52:
    cc_local._4_4_ = 1;
    break;
  case 0x55:
  case 0x56:
  case 0x57:
  case 0x58:
  case 0x5e:
  case 0x5f:
    local_21 = false;
    if (cc[1] != 0x11) {
      local_21 = cc[1] != 0x16;
    }
    cc_local._4_4_ = (uint)local_21;
    break;
  case 0x6e:
  case 0x6f:
  case 0x70:
    if (*cc == 0x70) {
      local_28 = (uint)cc[1];
    }
    else {
      local_28 = 0x11;
    }
    uVar1 = (uint)cc[(int)local_28];
    if ((uVar1 - 0x62 < 4) || (uVar1 == 0x6a || uVar1 == 0x6b)) {
      return 1;
    }
  default:
    cc_local._4_4_ = 0;
  }
  return cc_local._4_4_;
}

Assistant:

static BOOL is_accelerated_repeat(PCRE2_SPTR cc)
{
switch(*cc)
  {
  case OP_TYPESTAR:
  case OP_TYPEMINSTAR:
  case OP_TYPEPLUS:
  case OP_TYPEMINPLUS:
  case OP_TYPEPOSSTAR:
  case OP_TYPEPOSPLUS:
  return (cc[1] != OP_ANYNL && cc[1] != OP_EXTUNI);

  case OP_STAR:
  case OP_MINSTAR:
  case OP_PLUS:
  case OP_MINPLUS:
  case OP_POSSTAR:
  case OP_POSPLUS:

  case OP_STARI:
  case OP_MINSTARI:
  case OP_PLUSI:
  case OP_MINPLUSI:
  case OP_POSSTARI:
  case OP_POSPLUSI:

  case OP_NOTSTAR:
  case OP_NOTMINSTAR:
  case OP_NOTPLUS:
  case OP_NOTMINPLUS:
  case OP_NOTPOSSTAR:
  case OP_NOTPOSPLUS:

  case OP_NOTSTARI:
  case OP_NOTMINSTARI:
  case OP_NOTPLUSI:
  case OP_NOTMINPLUSI:
  case OP_NOTPOSSTARI:
  case OP_NOTPOSPLUSI:
  return TRUE;

  case OP_CLASS:
  case OP_NCLASS:
#if defined SUPPORT_UNICODE || PCRE2_CODE_UNIT_WIDTH != 8
  case OP_XCLASS:
  cc += (*cc == OP_XCLASS) ? GET(cc, 1) : (int)(1 + (32 / sizeof(PCRE2_UCHAR)));
#else
  cc += (1 + (32 / sizeof(PCRE2_UCHAR)));
#endif

  switch(*cc)
    {
    case OP_CRSTAR:
    case OP_CRMINSTAR:
    case OP_CRPLUS:
    case OP_CRMINPLUS:
    case OP_CRPOSSTAR:
    case OP_CRPOSPLUS:
    return TRUE;
    }
  break;
  }
return FALSE;
}